

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::CreateScenarioLowerBound(BaseTag *this)

{
  string *in_RDX;
  string *in_RSI;
  
  CreateScenarioLowerBound
            ((BaseTag *)
             &this[-1].memory_pool_.freelist_.
              super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
              super__Vector_impl_data._M_finish,in_RSI,in_RDX);
  return;
}

Assistant:

ScenarioLowerBound* BaseTag::CreateScenarioLowerBound(string name, string
	particle_bound_name) const {
	const DSPOMDP* model = this;
	const StateIndexer* indexer = this;
	const StatePolicy* policy = this;
	const MMAPInferencer* mmap_inferencer = this;
	if (name == "TRIVIAL") {
		return new TrivialParticleLowerBound(model);
	} else if (name == "RANDOM") {
		return new RandomPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "SHR"
		|| (name == "DEFAULT" && same_loc_obs_ != floor_.NumCells())) {
		return new TagSHRPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "HM") {
		return new TagHistoryModePolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MMAP-MDP") {
		ComputeDefaultActions("MDP");
		return new MMAPStatePolicy(model, *mmap_inferencer,
			*policy, CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MMAP-SP") {
		ComputeDefaultActions("SP");
		return new MMAPStatePolicy(model, *mmap_inferencer,
			*policy, CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE-MDP"
		|| (name == "DEFAULT" && same_loc_obs_ == floor_.NumCells())) {
		ComputeDefaultActions("MDP");
		return new ModeStatePolicy(model, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE-SP") {
		ComputeDefaultActions("SP");
		return new ModeStatePolicy(model, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MAJORITY-MDP") {
		ComputeDefaultActions("MDP");
		return new MajorityActionPolicy(model, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MAJORITY-SP") {
		ComputeDefaultActions("SP");
		return new MajorityActionPolicy(model, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else {
		if (name != "print")
			cerr << "Unsupported lower bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, RANDOM, SHR, MODE-MDP, MODE-SP, MAJORITY-MDP, MAJORITY-SP (default to MODE-MDP)" << endl;
		cerr << "With base lower bound: except TRIVIAL" << endl;
		exit(1);
		return NULL;
	}
}